

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

ExtPubkey * __thiscall
cfd::core::HDWallet::GeneratePubkey
          (ExtPubkey *__return_storage_ptr__,HDWallet *this,NetType network_type)

{
  ExtPrivkey privkey;
  ExtPrivkey EStack_88;
  
  ExtPrivkey::ExtPrivkey(&EStack_88,&this->seed_,network_type);
  ExtPrivkey::GetExtPubkey(__return_storage_ptr__,&EStack_88);
  ExtPrivkey::~ExtPrivkey(&EStack_88);
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey HDWallet::GeneratePubkey(NetType network_type) const {
  ExtPrivkey privkey(seed_, network_type);
  return privkey.GetExtPubkey();
}